

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.h
# Opt level: O0

Var __thiscall
Js::DataView::GetValue<unsigned_int>(DataView *this,Var offset,char16 *funcName,BOOL isLittleEndian)

{
  uint32 nValue;
  bool bVar1;
  ArrayBufferBase *this_00;
  uchar **ppuVar2;
  ScriptContext *scriptContext_00;
  Var pvVar3;
  uint *typedBuffer;
  uint32 local_38;
  uint item;
  uint32 byteOffset;
  uint32 length;
  ScriptContext *scriptContext;
  char16 *pcStack_20;
  BOOL isLittleEndian_local;
  char16 *funcName_local;
  Var offset_local;
  DataView *this_local;
  
  scriptContext._4_4_ = isLittleEndian;
  pcStack_20 = funcName;
  funcName_local = (char16 *)offset;
  offset_local = this;
  _byteOffset = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  item = ArrayObject::GetLength((ArrayObject *)this);
  if (item < 4) {
    JavascriptError::ThrowRangeError(_byteOffset,-0x7ff5ec1f,pcStack_20);
  }
  local_38 = ArrayBuffer::ToIndex(funcName_local,-0x7ff5ec1f,_byteOffset,item - 4,false);
  this_00 = ArrayBufferParent::GetArrayBuffer(&this->super_ArrayBufferParent);
  bVar1 = ArrayBufferBase::IsDetached(this_00);
  if (!bVar1) {
    ppuVar2 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                        ((WriteBarrierPtr *)&this->buffer);
    if (scriptContext._4_4_ == 0) {
      SwapRoutine<unsigned_int>
                (this,(uint32 *)(*ppuVar2 + local_38),(uint32 *)((long)&typedBuffer + 4));
    }
    else {
      typedBuffer._4_4_ = *(uint32 *)(*ppuVar2 + local_38);
    }
    nValue = typedBuffer._4_4_;
    scriptContext_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    pvVar3 = JavascriptNumber::ToVar(nValue,scriptContext_00);
    return pvVar3;
  }
  JavascriptError::ThrowTypeError(_byteOffset,-0x7ff5ebe5,pcStack_20);
}

Assistant:

Var GetValue(Var offset, const char16* funcName, BOOL isLittleEndian = FALSE)
        {
            ScriptContext* scriptContext = GetScriptContext();

            uint32 length = GetLength();
            if (length < sizeof(TypeName))
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_DataView_InvalidOffset, funcName);
            }

            uint32 byteOffset = ArrayBuffer::ToIndex(offset, JSERR_DataView_InvalidOffset, scriptContext, length - sizeof(TypeName), false);
            if (this->GetArrayBuffer()->IsDetached())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, funcName);
            }

            TypeName item;
            TypeName* typedBuffer = (TypeName*)(buffer + byteOffset);
            if (!isLittleEndian)
            {
                SwapRoutine<TypeName>(typedBuffer, &item);
            }
            else
            {
                item = *typedBuffer;
            }
            return JavascriptNumber::ToVar(item, GetScriptContext());
        }